

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

pthread_t * gpioStartThread(gpioThreadFunc_t *f,void *userdata)

{
  FILE *__stream;
  int iVar1;
  pthread_t *__newthread;
  pthread_attr_t pthAttr;
  pthread_attr_t local_50;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: f=%08X, userdata=%08X\n",myTimeStamp::buf,"gpioStartThread",
            (ulong)f & 0xffffffff,(ulong)userdata & 0xffffffff);
  }
  if (libInitialised != '\0') {
    __newthread = (pthread_t *)malloc(8);
    if (__newthread == (pthread_t *)0x0) {
      return (pthread_t *)0x0;
    }
    iVar1 = pthread_attr_init(&local_50);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_setstacksize(&local_50,0x40000);
      if (iVar1 == 0) {
        iVar1 = pthread_create(__newthread,&local_50,(__start_routine *)f,userdata);
        if (iVar1 == 0) {
          return __newthread;
        }
        free(__newthread);
      }
      else {
        free(__newthread);
      }
    }
    else {
      free(__newthread);
    }
  }
  if ((gpioCfg.internals >> 10 & 1) == 0) {
    gpioStartThread_cold_1();
  }
  return (pthread_t *)0x0;
}

Assistant:

pthread_t *gpioStartThread(gpioThreadFunc_t f, void *userdata)
{
   pthread_t *pth;
   pthread_attr_t pthAttr;

   DBG(DBG_USER, "f=%08X, userdata=%08X", (uint32_t)f, (uint32_t)userdata);

   CHECK_INITED_RET_NULL_PTR;

   pth = malloc(sizeof(pthread_t));

   if (pth)
   {
      if (pthread_attr_init(&pthAttr))
      {
         free(pth);
         SOFT_ERROR(NULL, "pthread_attr_init failed");
      }

      if (pthread_attr_setstacksize(&pthAttr, STACK_SIZE))
      {
         free(pth);
         SOFT_ERROR(NULL, "pthread_attr_setstacksize failed");
      }

      if (pthread_create(pth, &pthAttr, f, userdata))
      {
         free(pth);
         SOFT_ERROR(NULL, "pthread_create failed");
      }
   }
   return pth;
}